

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O3

void __thiscall wasm::FunctionHasher::~FunctionHasher(FunctionHasher *this)

{
  _Manager_type p_Var1;
  pointer pTVar2;
  
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__FunctionHasher_010722f0;
  p_Var1 = (this->customHasher).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->customHasher,(_Any_data *)&this->customHasher,__destroy_functor);
  }
  pTVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
           ).super_PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.
           super_Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>::Task,_std::allocator<wasm::Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>
                                          .
                                          super_Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>::Task,_std::allocator<wasm::Walker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar2);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x158);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }